

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

size_t drmp3__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong __n;
  
  __n = *(long *)((long)pUserData + 0x52e0) - *(long *)((long)pUserData + 0x52e8);
  if (bytesToRead <= __n) {
    __n = bytesToRead;
  }
  if (__n != 0) {
    memcpy(pBufferOut,
           (void *)(*(long *)((long)pUserData + 0x52e8) + *(long *)((long)pUserData + 0x52d8)),__n);
    *(long *)((long)pUserData + 0x52e8) = *(long *)((long)pUserData + 0x52e8) + __n;
  }
  return __n;
}

Assistant:

static size_t drmp3__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    drmp3* pMP3 = (drmp3*)pUserData;
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->memory.dataSize >= pMP3->memory.currentReadPos);

    size_t bytesRemaining = pMP3->memory.dataSize - pMP3->memory.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }

    if (bytesToRead > 0) {
        drmp3_copy_memory(pBufferOut, pMP3->memory.pData + pMP3->memory.currentReadPos, bytesToRead);
        pMP3->memory.currentReadPos += bytesToRead;
    }

    return bytesToRead;
}